

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O1

void h265e_nal_start(H265eExtraInfo *out,RK_S32 i_type,RK_S32 i_ref_idc)

{
  int iVar1;
  
  iVar1 = out->nal_num;
  out->nal[iVar1].i_ref_idc = i_ref_idc;
  out->nal[iVar1].i_type = i_type;
  out->nal[iVar1].b_long_startcode = 1;
  out->nal[iVar1].i_payload = 0;
  out->nal[iVar1].p_payload = (out->stream).buf + (out->stream).enc_stream.byte_cnt;
  out->nal[iVar1].i_padding = 0;
  out->nal[iVar1].temporal_id = out->temporal_id;
  return;
}

Assistant:

void h265e_nal_start(H265eExtraInfo *out, RK_S32 i_type,
                     RK_S32 i_ref_idc)
{
    H265eStream *s = &out->stream;
    H265eNal *nal = &out->nal[out->nal_num];

    nal->i_ref_idc = i_ref_idc;
    nal->i_type = i_type;
    nal->b_long_startcode = 1;

    nal->i_payload = 0;
    /* NOTE: consistent with stream_init */
    nal->p_payload = &s->buf[s->enc_stream.byte_cnt];
    nal->i_padding = 0;

    nal->temporal_id = out->temporal_id;
}